

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.c
# Opt level: O2

void test_msg_insert_header(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  nng_msg *local_20;
  nng_msg *msg;
  
  nVar1 = nng_msg_alloc(&local_20,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x4a,"%s: expected success, got %s (%d)","nng_msg_alloc(&msg, 0)",pcVar3,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_msg_header_append(local_20,"def",4);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                           ,0x4b,"%s: expected success, got %s (%d)",
                           "nng_msg_header_append(msg, \"def\", 4)",pcVar3,nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_msg_header_insert(local_20,"abc",3);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                             ,0x4c,"%s: expected success, got %s (%d)",
                             "nng_msg_header_insert(msg, \"abc\", 3)",pcVar3,nVar1);
      if (iVar2 != 0) {
        sVar4 = nng_msg_header_len(local_20);
        iVar2 = acutest_check_((uint)(sVar4 == 7),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                               ,0x4d,"%s","nng_msg_header_len(msg) == 7");
        if (iVar2 != 0) {
          pcVar3 = (char *)nng_msg_header(local_20);
          iVar2 = strcmp(pcVar3,"abcdef");
          iVar2 = acutest_check_((uint)(iVar2 == 0),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                 ,0x4e,"%s","strcmp(nng_msg_header(msg), \"abcdef\") == 0");
          if (iVar2 != 0) {
            nng_msg_free(local_20);
            return;
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_msg_insert_header(void)
{
	nng_msg *msg;
	NUTS_PASS(nng_msg_alloc(&msg, 0));
	NUTS_PASS(nng_msg_header_append(msg, "def", 4));
	NUTS_PASS(nng_msg_header_insert(msg, "abc", 3));
	NUTS_ASSERT(nng_msg_header_len(msg) == 7);
	NUTS_ASSERT(strcmp(nng_msg_header(msg), "abcdef") == 0);
	nng_msg_free(msg);
}